

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_test(stbi__context *s)

{
  undefined1 local_4798 [8];
  stbi__jpeg j;
  int r;
  stbi__context *s_local;
  
  local_4798 = (undefined1  [8])s;
  stbi__setup_jpeg((stbi__jpeg *)local_4798);
  j.resample_row_hv_2_kernel._4_4_ = stbi__decode_jpeg_header((stbi__jpeg *)local_4798,1);
  stbi__rewind(s);
  return j.resample_row_hv_2_kernel._4_4_;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg j;
   j.s = s;
   stbi__setup_jpeg(&j);
   r = stbi__decode_jpeg_header(&j, STBI__SCAN_type);
   stbi__rewind(s);
   return r;
}